

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dobject.cpp
# Opt level: O2

size_t DObject::StaticPointerSubstitution(DObject *old,DObject *notOld,bool scandefaults)

{
  DObject *this;
  PClassActor **ppPVar1;
  long lVar2;
  size_t sVar3;
  AActor *pAVar4;
  size_t changed;
  size_t sVar5;
  ulong uVar6;
  long lVar7;
  DObject *last;
  long *plVar8;
  player_t *this_00;
  TObjPtr<AActor> *obj;
  
  sVar5 = 0;
  for (plVar8 = &GC::Root; ppPVar1 = PClassActor::AllActorClasses.Array, plVar8 = (long *)*plVar8,
      plVar8 != (long *)0x0; plVar8 = plVar8 + 2) {
    lVar2 = (**(code **)(*plVar8 + 0x28))(plVar8,old,notOld);
    sVar5 = sVar5 + lVar2;
  }
  if (scandefaults) {
    uVar6 = (ulong)PClassActor::AllActorClasses.Count;
    for (lVar2 = 0; uVar6 << 3 != lVar2; lVar2 = lVar2 + 8) {
      this = (DObject *)(*(PClass **)((long)ppPVar1 + lVar2))->Defaults;
      if (this != (DObject *)0x0) {
        this->Class = *(PClass **)((long)ppPVar1 + lVar2);
        PointerSubstitution(this,old,notOld);
        this->Class = (PClass *)0x0;
      }
    }
  }
  for (lVar2 = 0; lVar2 != 0x20; lVar2 = lVar2 + 1) {
    if (bodyque[lVar2] == (AActor *)old) {
      bodyque[lVar2] = (AActor *)notOld;
      sVar5 = sVar5 + 1;
    }
  }
  this_00 = (player_t *)&players;
  for (lVar2 = 0; lVar2 != 8; lVar2 = lVar2 + 1) {
    if (playeringame[lVar2] == true) {
      sVar3 = player_t::FixPointers(this_00,old,notOld);
      sVar5 = sVar5 + sVar3;
    }
    this_00 = this_00 + 1;
  }
  obj = &(sectorPortals.Array)->mSkybox;
  for (lVar2 = (ulong)sectorPortals.Count << 6; lVar2 != 0; lVar2 = lVar2 + -0x40) {
    pAVar4 = GC::ReadBarrier<AActor>((AActor **)obj);
    if (pAVar4 == (AActor *)old) {
      (obj->field_0).o = notOld;
      sVar5 = sVar5 + 1;
    }
    obj = obj + 8;
  }
  if (sectors != (sector_t_conflict *)0x0) {
    lVar2 = 0;
    for (lVar7 = 0; lVar7 < numsectors; lVar7 = lVar7 + 1) {
      if (*(DObject **)((long)sectors->terrainnum + lVar2 + -0x48) == old) {
        *(DObject **)((long)sectors->terrainnum + lVar2 + -0x48) = notOld;
        sVar5 = sVar5 + 1;
      }
      if (*(DObject **)((long)sectors->Portals + lVar2 + -8) == old) {
        *(DObject **)((long)sectors->Portals + lVar2 + -8) = notOld;
        sVar5 = sVar5 + 1;
      }
      if (*(DObject **)((long)sectors->terrainnum + lVar2 + 8) == old) {
        *(DObject **)((long)sectors->terrainnum + lVar2 + 8) = notOld;
        sVar5 = sVar5 + 1;
      }
      if (*(DObject **)((long)sectors->terrainnum + lVar2 + 0x10) == old) {
        *(DObject **)((long)sectors->terrainnum + lVar2 + 0x10) = notOld;
        sVar5 = sVar5 + 1;
      }
      if (*(DObject **)
           ((long)&((TObjPtr<DSectorEffect> *)(sectors->interpolations + -1))->field_0 + lVar2) ==
          old) {
        *(DObject **)
         ((long)&((TObjPtr<DSectorEffect> *)(sectors->interpolations + -1))->field_0 + lVar2) =
             notOld;
        sVar5 = sVar5 + 1;
      }
      lVar2 = lVar2 + 0x218;
    }
  }
  if (bglobal.firstthing.field_0 == (anon_union_8_2_947301c2_for_TObjPtr<AActor>_1)old) {
    sVar5 = sVar5 + 1;
    bglobal.firstthing.field_0 = (anon_union_8_2_947301c2_for_TObjPtr<AActor>_1)notOld;
  }
  if (bglobal.body1.field_0 == (anon_union_8_2_947301c2_for_TObjPtr<AActor>_1)old) {
    sVar5 = sVar5 + 1;
    bglobal.body1.field_0 = (anon_union_8_2_947301c2_for_TObjPtr<AActor>_1)notOld;
  }
  if (bglobal.body2.field_0 == (anon_union_8_2_947301c2_for_TObjPtr<AActor>_1)old) {
    sVar5 = sVar5 + 1;
    bglobal.body2.field_0 = (anon_union_8_2_947301c2_for_TObjPtr<AActor>_1)notOld;
  }
  return sVar5;
}

Assistant:

size_t DObject::StaticPointerSubstitution (DObject *old, DObject *notOld, bool scandefaults)
{
	DObject *probe;
	size_t changed = 0;
	int i;

	// Go through all objects.
	i = 0;DObject *last=0;
	for (probe = GC::Root; probe != NULL; probe = probe->ObjNext)
	{
		i++;
		changed += probe->PointerSubstitution(old, notOld);
		last = probe;
	}

	if (scandefaults)
	{
		for (auto p : PClassActor::AllActorClasses)
		{
			auto def = GetDefaultByType(p);
			if (def != nullptr)
			{
				def->Class = p;
				def->DObject::PointerSubstitution(old, notOld);
				def->Class = nullptr;	// reset pointer. Defaults should not have a valid class pointer.
			}
		}
	}

	// Go through the bodyque.
	for (i = 0; i < BODYQUESIZE; ++i)
	{
		if (bodyque[i] == old)
		{
			bodyque[i] = static_cast<AActor *>(notOld);
			changed++;
		}
	}

	// Go through players.
	for (i = 0; i < MAXPLAYERS; i++)
	{
		if (playeringame[i])
			changed += players[i].FixPointers (old, notOld);
	}

	for (auto &s : sectorPortals)
	{
		if (s.mSkybox == old)
		{
			s.mSkybox = static_cast<ASkyViewpoint*>(notOld);
			changed++;
		}
	}

	// Go through sectors.
	if (sectors != NULL)
	{
		for (i = 0; i < numsectors; ++i)
		{
#define SECTOR_CHECK(f,t) \
	if (sectors[i].f.p == static_cast<t *>(old)) { sectors[i].f = static_cast<t *>(notOld); changed++; }
			SECTOR_CHECK( SoundTarget, AActor );
			SECTOR_CHECK( SecActTarget, ASectorAction );
			SECTOR_CHECK( floordata, DSectorEffect );
			SECTOR_CHECK( ceilingdata, DSectorEffect );
			SECTOR_CHECK( lightingdata, DSectorEffect );
#undef SECTOR_CHECK
		}
	}

	// Go through bot stuff.
	if (bglobal.firstthing.p == (AActor *)old)		bglobal.firstthing = (AActor *)notOld, ++changed;
	if (bglobal.body1.p == (AActor *)old)			bglobal.body1 = (AActor *)notOld, ++changed;
	if (bglobal.body2.p == (AActor *)old)			bglobal.body2 = (AActor *)notOld, ++changed;

	return changed;
}